

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerPoll.cpp
# Opt level: O0

void __thiscall Liby::PollerPoll::addChanel(PollerPoll *this,Channel *ch)

{
  value_type vVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  bool bVar5;
  ushort uStack_20;
  short sStack_1e;
  pollfd pollfd1;
  int fd;
  Channel *ch_local;
  PollerPoll *this_local;
  
  bVar5 = false;
  if (ch != (Channel *)0x0) {
    iVar2 = Channel::get_fd(ch);
    bVar5 = -1 < iVar2;
  }
  if (bVar5) {
    iVar2 = Channel::get_fd(ch);
    uStack_20 = 0x2008;
    bVar5 = Channel::readable(ch);
    if (bVar5) {
      uStack_20 = 0x2009;
    }
    bVar5 = Channel::writable(ch);
    if (bVar5) {
      uStack_20 = uStack_20 | 4;
    }
    sVar3 = std::vector<pollfd,_std::allocator<pollfd>_>::size(&this->pollfds_);
    if (sVar3 <= (ulong)(long)iVar2) {
      std::vector<pollfd,_std::allocator<pollfd>_>::resize(&this->pollfds_,(long)(iVar2 * 2 + 1));
    }
    pvVar4 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[](&this->pollfds_,(long)iVar2);
    vVar1.events = uStack_20;
    vVar1.fd = iVar2;
    vVar1.revents = sStack_1e;
    *pvVar4 = vVar1;
    Poller::setChannel(&this->super_Poller,iVar2,ch);
    return;
  }
  __assert_fail("ch && ch->get_fd() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerPoll.cpp"
                ,9,"virtual void Liby::PollerPoll::addChanel(Channel *)");
}

Assistant:

void PollerPoll::addChanel(Channel *ch) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();

    struct pollfd pollfd1;
    pollfd1.fd = fd;
#ifdef __linux__
    pollfd1.events = POLLRDHUP | POLLERR;
#elif defined(__APPLE__)
    pollfd1.events = POLLERR | POLLHUP;
#endif
    if (ch->readable())
        pollfd1.events |= POLLIN;
    if (ch->writable())
        pollfd1.events |= POLLOUT;

    if (pollfds_.size() <= static_cast<decltype(pollfds_.size())>(fd))
        pollfds_.resize(fd * 2 + 1);

    pollfds_[fd] = pollfd1;
    setChannel(fd, ch);
}